

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus
readSolutionFileReturn
          (HighsStatus status,HighsSolution *solution,HighsBasis *basis,HighsSolution *read_solution
          ,HighsBasis *read_basis,ifstream *in_file)

{
  std::ifstream::close();
  if (status == kOk) {
    HighsSolution::operator=(solution,read_solution);
    HighsBasis::operator=(basis,read_basis);
  }
  return status;
}

Assistant:

HighsStatus readSolutionFileReturn(const HighsStatus status,
                                   HighsSolution& solution, HighsBasis& basis,
                                   const HighsSolution& read_solution,
                                   const HighsBasis& read_basis,
                                   std::ifstream& in_file) {
  in_file.close();
  if (status != HighsStatus::kOk) {
    return status;
  }
  solution = read_solution;
  basis = read_basis;
  return HighsStatus::kOk;
}